

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall
fasttext::Model::dfs
          (Model *this,int32_t k,int32_t node,real score,
          vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *heap,
          Vector *hidden)

{
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  __last;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  __last_00;
  size_type sVar1;
  reference pvVar2;
  const_reference pvVar3;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *in_RCX;
  int in_EDX;
  int in_ESI;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  in_RDI;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *in_R8;
  float in_XMM0_Da;
  real rVar4;
  undefined1 auVar5 [16];
  real f;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int64_t in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  float in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  in_stack_ffffffffffffffb0;
  Vector *in_stack_ffffffffffffffd0;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *this_00;
  real score_00;
  int32_t in_stack_ffffffffffffffe8;
  float k_00;
  
  sVar1 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::size(in_RCX);
  k_00 = in_XMM0_Da;
  if ((sVar1 != (long)in_ESI) ||
     (pvVar2 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::front
                         ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)),
     in_stack_ffffffffffffff9c = in_XMM0_Da, pvVar2->first <= in_XMM0_Da)) {
    pvVar3 = std::vector<fasttext::Node,_std::allocator<fasttext::Node>_>::operator[]
                       ((vector<fasttext::Node,_std::allocator<fasttext::Node>_> *)
                        &((Matrix *)((long)in_RDI._M_current + 0xc0))->m_,(long)in_EDX);
    if ((pvVar3->left == -1) &&
       (pvVar3 = std::vector<fasttext::Node,_std::allocator<fasttext::Node>_>::operator[]
                           ((vector<fasttext::Node,_std::allocator<fasttext::Node>_> *)
                            &((Matrix *)((long)in_RDI._M_current + 0xc0))->m_,(long)in_EDX),
       pvVar3->right == -1)) {
      this_00 = in_RCX;
      std::make_pair<float&,int&>
                ((float *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                 (int *)0x161f2c);
      std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::push_back
                ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (value_type *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::begin
                ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                 CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::end
                ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                 CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      __last_00._M_current._4_4_ = in_stack_ffffffffffffffac;
      __last_00._M_current._0_4_ = in_stack_ffffffffffffffa8;
      std::
      push_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>
                (in_stack_ffffffffffffffb0,__last_00,
                 (_func_bool_pair<float,_int>_ptr_pair<float,_int>_ptr *)in_RDI._M_current);
      sVar1 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::size
                        (this_00);
      if ((ulong)(long)in_ESI < sVar1) {
        std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::begin
                  ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                   CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::end
                  ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                   CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        __last._M_current._4_4_ = in_stack_ffffffffffffff9c;
        __last._M_current._0_4_ = in_stack_ffffffffffffff98;
        std::
        pop_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>
                  (in_RDI,__last,(_func_bool_pair<float,_int>_ptr_pair<float,_int>_ptr *)in_RCX);
        std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::pop_back
                  ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                   0x161fc6);
      }
    }
    else {
      score_00 = (real)((ulong)in_RCX >> 0x20);
      std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x161fd9);
      rVar4 = Matrix::dotRow((Matrix *)in_RDI._M_current,
                             (Vector *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
                             ,in_stack_ffffffffffffff90);
      rVar4 = utils::sigmoid(rVar4);
      std::vector<fasttext::Node,_std::allocator<fasttext::Node>_>::operator[]
                ((vector<fasttext::Node,_std::allocator<fasttext::Node>_> *)
                 &((Matrix *)((long)in_RDI._M_current + 0xc0))->m_,(long)in_EDX);
      auVar5._4_12_ = SUB1612(ZEXT816(0x3ff0000000000000),4);
      auVar5._0_4_ = 1.0 - rVar4;
      utils::log(auVar5._0_8_);
      dfs((Model *)CONCAT44(in_ESI,in_EDX),(int32_t)k_00,in_stack_ffffffffffffffe8,score_00,in_R8,
          in_stack_ffffffffffffffd0);
      std::vector<fasttext::Node,_std::allocator<fasttext::Node>_>::operator[]
                ((vector<fasttext::Node,_std::allocator<fasttext::Node>_> *)
                 &((Matrix *)((long)in_RDI._M_current + 0xc0))->m_,(long)in_EDX);
      utils::log((double)(ulong)(uint)rVar4);
      dfs((Model *)CONCAT44(in_ESI,in_EDX),(int32_t)k_00,in_stack_ffffffffffffffe8,score_00,in_R8,
          in_stack_ffffffffffffffd0);
    }
  }
  return;
}

Assistant:

void Model::dfs(int32_t k, int32_t node, real score,
                std::vector<std::pair<real, int32_t>>& heap,
                Vector& hidden) const {
  if (heap.size() == k && score < heap.front().first) {
    return;
  }

  if (tree[node].left == -1 && tree[node].right == -1) {
    heap.push_back(std::make_pair(score, node));
    std::push_heap(heap.begin(), heap.end(), comparePairs);
    if (heap.size() > k) {
      std::pop_heap(heap.begin(), heap.end(), comparePairs);
      heap.pop_back();
    }
    return;
  }

  real f = utils::sigmoid(wo_->dotRow(hidden, node - osz_));
  dfs(k, tree[node].left, score + utils::log(1.0 - f), heap, hidden);
  dfs(k, tree[node].right, score + utils::log(f), heap, hidden);
}